

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::Recycled<Kernel::UnificationConstraintStack,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
~Recycled(Recycled<Kernel::UnificationConstraintStack,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *this)

{
  Stack<std::unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>_>
  *this_00;
  unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  *puVar1;
  _Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false> _Var2;
  
  _Var2._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
       ._M_t.
       super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
       .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (UnificationConstraintStack *)0x0) {
    if ((*(long *)&(_Var2._M_head_impl)->_cont != 0) &&
       (Recycled<Kernel::UnificationConstraintStack,Lib::DefaultReset,Lib::DefaultKeepRecycled>::
        memAlive == '\x01')) {
      *(UnificationConstraint **)((long)&(_Var2._M_head_impl)->_cont + 0x10) =
           *(UnificationConstraint **)((long)&(_Var2._M_head_impl)->_cont + 8);
      this_00 = mem();
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
           ._M_t.
           super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
           .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
      (this->_self)._M_t.
      super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
      ._M_t.
      super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
      .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl =
           (UnificationConstraintStack *)0x0;
      puVar1 = this_00->_cursor;
      if (puVar1 == this_00->_end) {
        Stack<std::unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>_>
        ::expand(this_00);
        puVar1 = this_00->_cursor;
      }
      (puVar1->_M_t).
      super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
      ._M_t.
      super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
      .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl =
           _Var2._M_head_impl;
      this_00->_cursor = this_00->_cursor + 1;
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
           ._M_t.
           super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
           .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
      if (_Var2._M_head_impl == (UnificationConstraintStack *)0x0) goto LAB_002caa53;
    }
    std::default_delete<Kernel::UnificationConstraintStack>::operator()
              ((default_delete<Kernel::UnificationConstraintStack> *)this,_Var2._M_head_impl);
  }
LAB_002caa53:
  (this->_self)._M_t.
  super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  ._M_t.
  super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
  .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl =
       (UnificationConstraintStack *)0x0;
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }